

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O0

int poptag(int f,int n)

{
  char **ppcVar1;
  tagstack __ptr;
  int iVar2;
  tagpos *s;
  line *dotp;
  int n_local;
  int f_local;
  
  __ptr.slh_first = shead.slh_first;
  if (shead.slh_first == (tagpos *)0x0) {
    dobeep();
    ewprintf("No previous location for find-tag invocation");
    n_local = 0;
  }
  else {
    ppcVar1 = &(shead.slh_first)->bname;
    shead.slh_first = ((shead.slh_first)->entry).sle_next;
    iVar2 = loadbuffer(*ppcVar1);
    if (iVar2 == 0) {
      free((__ptr.slh_first)->bname);
      free(__ptr.slh_first);
      n_local = 0;
    }
    else {
      curwp->w_dotline = (__ptr.slh_first)->dotline;
      curwp->w_doto = (__ptr.slh_first)->doto;
      s = (tagpos *)curwp->w_bufp->b_headp;
      while (iVar2 = (__ptr.slh_first)->dotline, (__ptr.slh_first)->dotline = iVar2 + -1, iVar2 != 0
            ) {
        s = (s->entry).sle_next;
      }
      curwp->w_dotp = (line *)s;
      free((__ptr.slh_first)->bname);
      free(__ptr.slh_first);
      n_local = 1;
    }
  }
  return n_local;
}

Assistant:

int
poptag(int f, int n)
{
	struct line *dotp;
	struct tagpos *s;

	if (SLIST_EMPTY(&shead)) {
		dobeep();
		ewprintf("No previous location for find-tag invocation");
		return (FALSE);
	}
	s = SLIST_FIRST(&shead);
	SLIST_REMOVE_HEAD(&shead, entry);
	if (loadbuffer(s->bname) == FALSE) {
		free(s->bname);
		free(s);
		return (FALSE);
	}
	curwp->w_dotline = s->dotline;
	curwp->w_doto = s->doto;

	/* storing of dotp in tagpos wouldn't work out in cases when
	 * that buffer is killed by user(dangling pointer). Explicitly
	 * traverse till dotline for correct handling.
	 */
	dotp = curwp->w_bufp->b_headp;
	while (s->dotline--)
		dotp = dotp->l_fp;

	curwp->w_dotp = dotp;
	free(s->bname);
	free(s);
	return (TRUE);
}